

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Type *type)

{
  allocator<char> local_81;
  string local_80;
  Type local_60;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  DartGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (DartGenerator *)__return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint8",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case BASE_TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Bool",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case BASE_TYPE_CHAR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int8",local_35);
    std::allocator<char>::~allocator(local_35);
    break;
  case BASE_TYPE_SHORT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int16",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case BASE_TYPE_USHORT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint16",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case BASE_TYPE_INT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int32",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case BASE_TYPE_UINT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint32",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case BASE_TYPE_LONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int64",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case BASE_TYPE_ULONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint64",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case BASE_TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float32",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case BASE_TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float64",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case BASE_TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_60,type);
    GenType_abi_cxx11_(__return_storage_ptr__,this,&local_60);
    break;
  case BASE_TYPE_STRUCT:
    IdlNamer::Type_abi_cxx11_(__return_storage_ptr__,&this->namer_,type->struct_def);
    break;
  case BASE_TYPE_UNION:
    IdlNamer::Type_abi_cxx11_(&local_80,&this->namer_,type->enum_def);
    std::operator+(__return_storage_ptr__,&local_80,"TypeId");
    std::__cxx11::string::~string((string *)&local_80);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Table",&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL: return "Bool";
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return namer_.Type(*type.struct_def);
      case BASE_TYPE_UNION: return namer_.Type(*type.enum_def) + "TypeId";
      default: return "Table";
    }
  }